

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sVertexArrayTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Stress::anon_unknown_1::SingleVertexArrayOffsetTests::init
          (SingleVertexArrayOffsetTests *this,EVP_PKEY_CTX *ctx)

{
  InputType type;
  TestContext *testCtx;
  GLValue min_;
  GLValue max_;
  int iVar1;
  int iVar2;
  MultiVertexArrayTest *this_00;
  RenderContext *renderCtx;
  char *name_00;
  char *desc;
  GLValue GVar3;
  GLValue GVar4;
  bool local_125;
  int local_124;
  undefined1 local_118 [8];
  string name;
  undefined1 local_e8 [8];
  Spec spec;
  undefined4 uStack_ac;
  undefined1 local_a0 [8];
  ArraySpec arraySpec;
  int iStack_54;
  bool aligned;
  int stride;
  int strideNdx;
  int countNdx;
  int offsetNdx;
  int inputTypeNdx;
  int strides [3];
  int offsets [4];
  int counts [2];
  InputType inputTypes [3];
  SingleVertexArrayOffsetTests *this_local;
  
  counts[0] = 0;
  counts[1] = 3;
  stack0xffffffffffffffdc = 0x10000000001;
  strides[1] = 1;
  strides[2] = 4;
  offsets[0] = 0x11;
  offsets[1] = 0x20;
  _offsetNdx = 0x11ffffffff;
  iVar1 = 0x20;
  strides[0] = 0x20;
  countNdx = 0;
  while (countNdx < 3) {
    for (strideNdx = 0; strideNdx < 4; strideNdx = strideNdx + 1) {
      for (stride = 0; stride < 2; stride = stride + 1) {
        for (iStack_54 = 0; iStack_54 < 3; iStack_54 = iStack_54 + 1) {
          if ((&offsetNdx)[iStack_54] < 0) {
            local_124 = deqp::gls::Array::inputTypeSize(counts[countNdx]);
            local_124 = local_124 << 1;
          }
          else {
            local_124 = (&offsetNdx)[iStack_54];
          }
          iVar1 = deqp::gls::Array::inputTypeSize(counts[countNdx]);
          local_125 = false;
          if (local_124 % iVar1 == 0) {
            iVar1 = strides[(long)strideNdx + 1];
            iVar2 = deqp::gls::Array::inputTypeSize(counts[countNdx]);
            local_125 = iVar1 % iVar2 == 0;
          }
          arraySpec.max.field_1._7_1_ = local_125;
          type = counts[countNdx];
          iVar1 = strides[(long)strideNdx + 1];
          GVar3 = deqp::gls::GLValue::getMinValue(type);
          GVar4 = deqp::gls::GLValue::getMaxValue(counts[countNdx]);
          spec.arrays.
          super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = GVar4.type;
          max_._4_4_ = spec.arrays.
                       super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          max_.type = (InputType)
                      spec.arrays.
                      super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
          min_._4_4_ = uStack_ac;
          min_.type = GVar3.type;
          min_.field_1 = GVar3.field_1;
          max_.field_1 = GVar4.field_1;
          deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                    ((ArraySpec *)local_a0,type,OUTPUTTYPE_VEC2,STORAGE_BUFFER,USAGE_DYNAMIC_DRAW,2,
                     iVar1,local_124,false,min_,max_);
          deqp::gls::MultiVertexArrayTest::Spec::Spec((Spec *)local_e8);
          local_e8._0_4_ = PRIMITIVE_TRIANGLES;
          local_e8._4_4_ = offsets[(long)stride + 3];
          spec.primitive = PRIMITIVE_POINTS;
          std::
          vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
          ::push_back((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                       *)&spec.first,(ArraySpec *)local_a0);
          deqp::gls::MultiVertexArrayTest::Spec::getName_abi_cxx11_
                    ((string *)local_118,(Spec *)local_e8);
          if ((arraySpec.max.field_1._7_1_ & 1) == 0) {
            this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
            testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
            renderCtx = Context::getRenderContext((this->super_TestCaseGroup).m_context);
            name_00 = (char *)std::__cxx11::string::c_str();
            desc = (char *)std::__cxx11::string::c_str();
            deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                      (this_00,testCtx,renderCtx,(Spec *)local_e8,name_00,desc);
            tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
          }
          std::__cxx11::string::~string((string *)local_118);
          deqp::gls::MultiVertexArrayTest::Spec::~Spec((Spec *)local_e8);
        }
      }
    }
    iVar1 = countNdx + 1;
    countNdx = iVar1;
  }
  return iVar1;
}

Assistant:

void SingleVertexArrayOffsetTests::init (void)
{
	// Test strides with different input types, component counts and storage, Usage(?)
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_BYTE, Array::INPUTTYPE_FIXED};
	int					counts[]		= {1, 256};
	int					offsets[]		= {1, 4, 17, 32};
	int					strides[]		= {/*0,*/ -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
		{
			for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
			{
				for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
				{
					const int	stride	= (strides[strideNdx] < 0 ? Array::inputTypeSize(inputTypes[inputTypeNdx]) * 2 : strides[strideNdx]);
					const bool	aligned	= ((stride % Array::inputTypeSize(inputTypes[inputTypeNdx])) == 0) && ((offsets[offsetNdx] % Array::inputTypeSize(inputTypes[inputTypeNdx])) == 0);

					MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																	Array::OUTPUTTYPE_VEC2,
																	Array::STORAGE_BUFFER,
																	Array::USAGE_DYNAMIC_DRAW,
																	2,
																	offsets[offsetNdx],
																	stride,
																	false,
																	GLValue::getMinValue(inputTypes[inputTypeNdx]),
																	GLValue::getMaxValue(inputTypes[inputTypeNdx]));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= 0;
					spec.arrays.push_back(arraySpec);

					std::string name = spec.getName();
					if (!aligned)
						addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}